

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_kmgmt.c
# Opt level: O0

int dh_validate_public(DH *dh,int checktype)

{
  int iVar1;
  int in_ESI;
  DH *in_RDI;
  int res;
  BIGNUM *pub_key;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  DH *dh_00;
  int local_4;
  
  dh_00 = (DH *)0x0;
  iVar2 = 0;
  DH_get0_key(in_RDI,(BIGNUM **)&stack0xffffffffffffffe0,(BIGNUM **)0x0);
  if (dh_00 == (DH *)0x0) {
    local_4 = 0;
  }
  else {
    if ((in_ESI == 1) && (iVar1 = ossl_dh_is_named_safe_prime_group(dh_00), iVar1 != 0)) {
      iVar2 = ossl_dh_check_pub_key_partial
                        (dh_00,(BIGNUM *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),(int *)0x33187d);
      return iVar2;
    }
    local_4 = DH_check_pub_key((DH *)in_RDI,(BIGNUM *)dh_00,(int *)&stack0xffffffffffffffdc);
  }
  return local_4;
}

Assistant:

static int dh_validate_public(const DH *dh, int checktype)
{
    const BIGNUM *pub_key = NULL;
    int res = 0;

    DH_get0_key(dh, &pub_key, NULL);
    if (pub_key == NULL)
        return 0;

    /* The partial test is only valid for named group's with q = (p - 1) / 2 */
    if (checktype == OSSL_KEYMGMT_VALIDATE_QUICK_CHECK
        && ossl_dh_is_named_safe_prime_group(dh))
        return ossl_dh_check_pub_key_partial(dh, pub_key, &res);

    return DH_check_pub_key(dh, pub_key, &res);
}